

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int decode_new_session_ticket
              (uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *ticket,
              uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  ushort uVar4;
  long lVar5;
  ulong uVar6;
  ushort *puVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ushort *puVar11;
  ushort uVar12;
  
  lVar5 = (long)end - (long)src;
  iVar3 = 0x32;
  if (3 < lVar5) {
    uVar2 = *(uint *)src;
    *lifetime = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    if (3 < lVar5 + -4) {
      uVar2 = *(uint *)(src + 4);
      *age_add = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (1 < lVar5 - 8U) {
        uVar6 = (ulong)src[8] * 0x100;
        uVar9 = (ulong)src[9];
        puVar1 = src + 10;
        if ((uVar6 + uVar9) - 1 < (ulong)((long)end - (long)puVar1)) {
          ticket->base = puVar1;
          ticket->len = (long)(src + uVar6 + uVar9 + 10) - (long)puVar1;
          *max_early_data_size = 0;
          if (1 < (ulong)((long)end - (long)(src + uVar6 + uVar9 + 10))) {
            uVar10 = (ulong)(ushort)(*(ushort *)(src + uVar6 + uVar9 + 10) << 8 |
                                    *(ushort *)(src + uVar6 + uVar9 + 10) >> 8);
            puVar7 = (ushort *)(src + (uVar6 | uVar9) + 0xc);
            if (uVar10 <= (ulong)((long)end - (long)puVar7)) {
              puVar11 = puVar7;
              if (uVar10 != 0) {
                puVar11 = (ushort *)(src + uVar10 + (uVar6 | uVar9) + 0xc);
                bVar8 = 0;
                do {
                  if ((long)puVar11 - (long)puVar7 < 2) {
                    return 0x32;
                  }
                  uVar4 = *puVar7;
                  uVar12 = uVar4 << 8 | uVar4 >> 8;
                  if (uVar12 < 8) {
                    if ((bVar8 >> (uVar12 & 0x1f) & 1) != 0) {
                      return 0x2f;
                    }
                    bVar8 = (byte)(1 << ((byte)(uVar4 >> 8) & 0x1f)) & 7 | bVar8;
                  }
                  if ((ulong)((long)puVar11 - (long)(puVar7 + 1)) < 2) {
                    return 0x32;
                  }
                  uVar4 = puVar7[1] << 8 | puVar7[1] >> 8;
                  if (((long)puVar11 - (long)puVar7) - 4U < (ulong)uVar4) {
                    return 0x32;
                  }
                  if (uVar12 == 0x2e) {
                    if (uVar4 < 4) {
                      return 0x32;
                    }
                    uVar2 = *(uint *)(puVar7 + 2);
                    *max_early_data_size =
                         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                         uVar2 << 0x18;
                    if (uVar4 != 4) {
                      return 0x32;
                    }
                    puVar7 = puVar7 + 4;
                  }
                  else {
                    puVar7 = (ushort *)((long)puVar7 + (ulong)uVar4 + 4);
                  }
                } while (puVar7 != puVar11);
              }
              iVar3 = 0x32;
              if (puVar11 == (ushort *)end) {
                iVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int decode_new_session_ticket(uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *ticket, uint32_t *max_early_data_size,
                                     const uint8_t *src, const uint8_t *end)
{
    uint16_t exttype;
    int ret;

    if ((ret = decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = decode32(age_add, &src, end)) != 0)
        goto Exit;
    decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, &exttype, {
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_TICKET_EARLY_DATA_INFO:
            if ((ret = decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}